

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pricing_session.cpp
# Opt level: O2

vector<bidfx_public_api::price::provider::ProviderProperties,_std::allocator<bidfx_public_api::price::provider::ProviderProperties>_>
* __thiscall
bidfx_public_api::price::PricingSession::GetProviderProperties
          (vector<bidfx_public_api::price::provider::ProviderProperties,_std::allocator<bidfx_public_api::price::provider::ProviderProperties>_>
           *__return_storage_ptr__,PricingSession *this)

{
  initializer_list<bidfx_public_api::price::provider::ProviderProperties> __l;
  allocator_type local_59;
  ProviderProperties local_58;
  
  (*(this->pixie_provider_->super_Subscriber)._vptr_Subscriber[8])(&local_58);
  __l._M_len = 1;
  __l._M_array = &local_58;
  std::
  vector<bidfx_public_api::price::provider::ProviderProperties,_std::allocator<bidfx_public_api::price::provider::ProviderProperties>_>
  ::vector(__return_storage_ptr__,__l,&local_59);
  provider::ProviderProperties::~ProviderProperties(&local_58);
  return __return_storage_ptr__;
}

Assistant:

std::vector<ProviderProperties> PricingSession::GetProviderProperties()
{
    return {pixie_provider_->GetProperties()};
}